

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QVariant_(*)(const_void_*,_const_void_*,_double)>::reallocate
          (QPodArrayOps<QVariant_(*)(const_void_*,_const_void_*,_double)> *this,qsizetype alloc,
          AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  _func_QVariant_void_ptr_void_ptr_double **in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QVariant_(*)(const_void_*,_const_void_*,_double)>_*,_QVariant_(**)(const_void_*,_const_void_*,_double)>
  pVar2;
  pair<QTypedArrayData<QVariant_(*)(const_void_*,_const_void_*,_double)>_*,_QVariant_(**)(const_void_*,_const_void_*,_double)>
  pair;
  _func_QVariant_void_ptr_void_ptr_double **local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QVariant_(*)(const_void_*,_const_void_*,_double)>::reallocateUnaligned
                    ((QTypedArrayData<QVariant_(*)(const_void_*,_const_void_*,_double)> *)
                     &DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX);
  local_10 = pVar2.second;
  if (local_10 == (_func_QVariant_void_ptr_void_ptr_double **)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    *in_RDI = (_func_QVariant_void_ptr_void_ptr_double *)pVar2.first;
    in_RDI[1] = (_func_QVariant_void_ptr_void_ptr_double *)local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }